

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

string * __thiscall
dmlc::StackTrace_abi_cxx11_
          (string *__return_storage_ptr__,dmlc *this,size_t start_frame,size_t stack_size)

{
  int iVar1;
  void *__ptr;
  ostream *poVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *msg_str;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  string msg;
  vector<void_*,_std::allocator<void_*>_> stack;
  ostringstream stacktrace_os;
  string local_1e0;
  vector<void_*,_std::allocator<void_*>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (&local_1c0,start_frame,(allocator_type *)&local_1e0);
  iVar1 = backtrace(local_1c0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,start_frame & 0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Stack trace:\n",0xd);
  auVar5 = backtrace_symbols(local_1c0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start,iVar1);
  msg_str = auVar5._8_8_;
  __ptr = auVar5._0_8_;
  iVar3 = (int)this;
  if (iVar3 < iVar1 && __ptr != (void *)0x0) {
    lVar4 = 0;
    do {
      Demangle_abi_cxx11_(&local_1e0,*(dmlc **)((long)__ptr + lVar4 * 8 + (long)iVar3 * 8),msg_str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  [bt] (",8);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      msg_str = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
        msg_str = extraout_RDX_00;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 - iVar3 != (int)lVar4);
  }
  free(__ptr);
  std::__cxx11::stringbuf::str();
  if (local_1c0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StackTrace(
    size_t start_frame = 1,
    const size_t stack_size = DMLC_LOG_STACK_TRACE_SIZE) {
  using std::string;
  std::ostringstream stacktrace_os;
  std::vector<void*> stack(stack_size);
  int nframes = backtrace(stack.data(), static_cast<int>(stack_size));
  stacktrace_os << "Stack trace:\n";
  char **msgs = backtrace_symbols(stack.data(), nframes);
  if (msgs != nullptr) {
    for (int frameno = start_frame; frameno < nframes; ++frameno) {
      string msg = dmlc::Demangle(msgs[frameno]);
      stacktrace_os << "  [bt] (" << frameno - start_frame << ") " << msg << "\n";
    }
  }
  free(msgs);
  string stack_trace = stacktrace_os.str();
  return stack_trace;
}